

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.c
# Opt level: O2

void decode_module(wasm_reader *wr,module *m)

{
  byte bVar1;
  byte bVar2;
  
  (*(wr->wr_op).open)(wr,m->bin);
  get_magic_version_num(wr,m);
  m->custom_segment_count = 0;
  m->custom_sec = (custom_segment *)0x0;
  bVar2 = 1;
  while( true ) {
    bVar1 = (*(wr->wr_op).read_byte)(wr);
    if ((bVar1 != 0) && ((0xb < bVar1 || (bVar1 < bVar2)))) break;
    (*wr->decode_segment[bVar1])(wr,m);
    bVar2 = bVar1 + 1;
    if (wr->model_size <= wr->index) {
      return;
    }
  }
  fwrite("secID get wrong\n",0x10,1,_stderr);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Kingdo777[P]WCasm/wasm/module.c"
                ,0x29,"void decode_module(wasm_reader *, module *)");
}

Assistant:

void decode_module(wasm_reader *wr, module *m) {
    byte secID;
    byte current_secID = type_segment_id;
    wr->wr_op.open(wr, m->bin);
    get_magic_version_num(wr, m);
    m->custom_segment_count = 0;
    m->custom_sec = NULL;
    while (true) {
        secID = wr->wr_op.read_byte(wr);
        if (secID != custom_segment_id && secID < current_secID || secID >= segment_count) {
            errorExit("secID get wrong\n");
        }
        wr->decode_segment[secID](wr, m);
        current_secID = secID + 1;
        if (wr->index >= wr->model_size)
            break;
    }
}